

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O1

string * __thiscall
rcdiscover::(anonymous_namespace)::extract_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,uint8_t *p,size_t len)

{
  _anonymous_namespace_ _Var1;
  uint8_t *puVar2;
  bool bVar3;
  ostringstream out;
  _anonymous_namespace_ local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  _Var1 = *this;
  if (p != (uint8_t *)0x0 && _Var1 != (_anonymous_namespace_)0x0) {
    puVar2 = (uint8_t *)0x1;
    do {
      local_1a9 = _Var1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)&local_1a9,1);
      _Var1 = this[(long)puVar2];
      if (_Var1 == (_anonymous_namespace_)0x0) break;
      bVar3 = p != puVar2;
      puVar2 = puVar2 + 1;
    } while (bVar3);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string extract(const uint8_t *p, size_t len)
{
  std::ostringstream out;

  while (*p != 0 && len > 0)
  {
    out << static_cast<char>(*p);

    p++;
    len--;
  }

  return out.str();
}